

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindExtensionByCamelcaseName(Descriptor *this,string *key)

{
  bool bVar1;
  Descriptor *in_RDI;
  string *unaff_retaddr;
  FieldDescriptor *result;
  FieldDescriptor *local_8;
  
  file(in_RDI);
  local_8 = FileDescriptorTables::FindFieldByCamelcaseName
                      ((FileDescriptorTables *)key,result,unaff_retaddr);
  if ((local_8 == (FieldDescriptor *)0x0) ||
     (bVar1 = FieldDescriptor::is_extension(local_8), !bVar1)) {
    local_8 = (FieldDescriptor *)0x0;
  }
  return local_8;
}

Assistant:

const FieldDescriptor* Descriptor::FindExtensionByCamelcaseName(
    const std::string& key) const {
  const FieldDescriptor* result =
      file()->tables_->FindFieldByCamelcaseName(this, key);
  if (result == nullptr || !result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}